

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O2

void prngCOMBOStart(void *state,u32 seed)

{
  int iVar1;
  
  *(undefined8 *)state = 0xbee3b54bf8b7bb93;
  iVar1 = 0;
  if (seed != 0xe0948043) {
    iVar1 = seed + 0x1f6b7fbe;
  }
  *(int *)((long)state + 8) = iVar1;
  *(undefined8 *)((long)state + 0x10) = 0;
  return;
}

Assistant:

void prngCOMBOStart(void* state, u32 seed)
{
	prng_combo_st* s = (prng_combo_st*)state;
	ASSERT(memIsValid(s, sizeof(*s)));
	s->x = 0xF8B7BB93;
	s->y = 0xBEE3B54B;
	s->z = 0x1F6B7FBD + seed;
	if (s->z)
		++s->z;
	s->reserved = 0;
}